

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::PrimReserve(ImDrawList *this,int idx_count,int vtx_count)

{
  int iVar1;
  ImDrawVert *__src;
  uint *__src_00;
  ImDrawVert *__dest;
  uint *puVar2;
  int iVar3;
  int iVar4;
  
  puVar2 = &(this->CmdBuffer).Data[(long)(this->CmdBuffer).Size + -1].ElemCount;
  *puVar2 = *puVar2 + idx_count;
  iVar1 = (this->VtxBuffer).Size;
  iVar4 = vtx_count + iVar1;
  iVar3 = (this->VtxBuffer).Capacity;
  if (iVar3 < iVar4) {
    if (iVar3 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar3 / 2 + iVar3;
    }
    if (iVar3 <= iVar4) {
      iVar3 = iVar4;
    }
    __dest = (ImDrawVert *)ImGui::MemAlloc((long)iVar3 * 0x14);
    __src = (this->VtxBuffer).Data;
    if (__src != (ImDrawVert *)0x0) {
      memcpy(__dest,__src,(long)(this->VtxBuffer).Size * 0x14);
      ImGui::MemFree((this->VtxBuffer).Data);
    }
    (this->VtxBuffer).Data = __dest;
    (this->VtxBuffer).Capacity = iVar3;
  }
  else {
    __dest = (this->VtxBuffer).Data;
  }
  (this->VtxBuffer).Size = iVar4;
  this->_VtxWritePtr = __dest + iVar1;
  iVar1 = (this->IdxBuffer).Size;
  iVar4 = idx_count + iVar1;
  iVar3 = (this->IdxBuffer).Capacity;
  if (iVar3 < iVar4) {
    if (iVar3 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar3 / 2 + iVar3;
    }
    if (iVar3 <= iVar4) {
      iVar3 = iVar4;
    }
    puVar2 = (uint *)ImGui::MemAlloc((long)iVar3 << 2);
    __src_00 = (this->IdxBuffer).Data;
    if (__src_00 != (uint *)0x0) {
      memcpy(puVar2,__src_00,(long)(this->IdxBuffer).Size << 2);
      ImGui::MemFree((this->IdxBuffer).Data);
    }
    (this->IdxBuffer).Data = puVar2;
    (this->IdxBuffer).Capacity = iVar3;
  }
  else {
    puVar2 = (this->IdxBuffer).Data;
  }
  (this->IdxBuffer).Size = iVar4;
  this->_IdxWritePtr = puVar2 + iVar1;
  return;
}

Assistant:

void ImDrawList::PrimReserve(int idx_count, int vtx_count)
{
    // Large mesh support (when enabled)
    IM_ASSERT_PARANOID(idx_count >= 0 && vtx_count >= 0);
    if (sizeof(ImDrawIdx) == 2 && (_VtxCurrentIdx + vtx_count >= (1 << 16)) && (Flags & ImDrawListFlags_AllowVtxOffset))
    {
        // FIXME: In theory we should be testing that vtx_count <64k here.
        // In practice, RenderText() relies on reserving ahead for a worst case scenario so it is currently useful for us
        // to not make that check until we rework the text functions to handle clipping and large horizontal lines better.
        _CmdHeader.VtxOffset = VtxBuffer.Size;
        _OnChangedVtxOffset();
    }

    ImDrawCmd* draw_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    draw_cmd->ElemCount += idx_count;

    int vtx_buffer_old_size = VtxBuffer.Size;
    VtxBuffer.resize(vtx_buffer_old_size + vtx_count);
    _VtxWritePtr = VtxBuffer.Data + vtx_buffer_old_size;

    int idx_buffer_old_size = IdxBuffer.Size;
    IdxBuffer.resize(idx_buffer_old_size + idx_count);
    _IdxWritePtr = IdxBuffer.Data + idx_buffer_old_size;
}